

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O2

char * WebPGetEnabledInputFileFormats(void)

{
  return "WebP, JPEG, PNG, PNM (PGM, PPM, PAM)";
}

Assistant:

const char* WebPGetEnabledInputFileFormats(void) {
  return "WebP"
#ifdef WEBP_HAVE_JPEG
         ", JPEG"
#endif
#ifdef WEBP_HAVE_PNG
         ", PNG"
#endif
         ", PNM (PGM, PPM, PAM)"
#ifdef WEBP_HAVE_TIFF
         ", TIFF"
#endif
#ifdef HAVE_WINCODEC_H
         ", Windows Imaging Component (WIC)"
#endif
         "";
}